

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_57051::DiskInterfaceTestStatExistingDir::Run
          (DiskInterfaceTestStatExistingDir *this)

{
  Test *pTVar1;
  bool bVar2;
  TimeStamp TVar3;
  TimeStamp TVar4;
  allocator<char> local_219;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  string local_128;
  allocator<char> local_101;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  undefined4 local_68;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [8];
  string err;
  DiskInterfaceTestStatExistingDir *this_local;
  
  err.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"subdir",&local_51);
  bVar2 = RealDiskInterface::MakeDir(&(this->super_DiskInterfaceTest).disk_,&local_50);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                     ,0x5a,"disk_.MakeDir(\"subdir\")");
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  pTVar1 = g_current_test;
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"subdir/subsubdir",&local_89);
    bVar2 = RealDiskInterface::MakeDir(&(this->super_DiskInterfaceTest).disk_,&local_88);
    bVar2 = testing::Test::Check
                      (pTVar1,bVar2,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                       ,0x5b,"disk_.MakeDir(\"subdir/subsubdir\")");
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    pTVar1 = g_current_test;
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"..",&local_b1);
      TVar3 = RealDiskInterface::Stat
                        (&(this->super_DiskInterfaceTest).disk_,&local_b0,(string *)local_30);
      testing::Test::Check
                (pTVar1,1 < TVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                 ,0x5c,"disk_.Stat(\"..\", &err) > 1");
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator(&local_b1);
      pTVar1 = g_current_test;
      bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_30);
      testing::Test::Check
                (pTVar1,bVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                 ,0x5d,"\"\" == err");
      pTVar1 = g_current_test;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,".",&local_d9);
      TVar3 = RealDiskInterface::Stat
                        (&(this->super_DiskInterfaceTest).disk_,&local_d8,(string *)local_30);
      testing::Test::Check
                (pTVar1,1 < TVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                 ,0x5e,"disk_.Stat(\".\", &err) > 1");
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator(&local_d9);
      pTVar1 = g_current_test;
      bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_30);
      testing::Test::Check
                (pTVar1,bVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                 ,0x5f,"\"\" == err");
      pTVar1 = g_current_test;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"subdir",&local_101);
      TVar3 = RealDiskInterface::Stat
                        (&(this->super_DiskInterfaceTest).disk_,&local_100,(string *)local_30);
      testing::Test::Check
                (pTVar1,1 < TVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                 ,0x60,"disk_.Stat(\"subdir\", &err) > 1");
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator(&local_101);
      pTVar1 = g_current_test;
      bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_30);
      testing::Test::Check
                (pTVar1,bVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                 ,0x61,"\"\" == err");
      pTVar1 = g_current_test;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,"subdir/subsubdir",&local_129);
      TVar3 = RealDiskInterface::Stat
                        (&(this->super_DiskInterfaceTest).disk_,&local_128,(string *)local_30);
      testing::Test::Check
                (pTVar1,1 < TVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                 ,0x62,"disk_.Stat(\"subdir/subsubdir\", &err) > 1");
      std::__cxx11::string::~string((string *)&local_128);
      std::allocator<char>::~allocator(&local_129);
      pTVar1 = g_current_test;
      bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_30);
      testing::Test::Check
                (pTVar1,bVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                 ,99,"\"\" == err");
      pTVar1 = g_current_test;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"subdir",&local_151);
      TVar3 = RealDiskInterface::Stat
                        (&(this->super_DiskInterfaceTest).disk_,&local_150,(string *)local_30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"subdir/.",&local_179)
      ;
      TVar4 = RealDiskInterface::Stat
                        (&(this->super_DiskInterfaceTest).disk_,&local_178,(string *)local_30);
      testing::Test::Check
                (pTVar1,TVar3 == TVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                 ,0x66,"disk_.Stat(\"subdir\", &err) == disk_.Stat(\"subdir/.\", &err)");
      std::__cxx11::string::~string((string *)&local_178);
      std::allocator<char>::~allocator(&local_179);
      std::__cxx11::string::~string((string *)&local_150);
      std::allocator<char>::~allocator(&local_151);
      pTVar1 = g_current_test;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"subdir",&local_1a1);
      TVar3 = RealDiskInterface::Stat
                        (&(this->super_DiskInterfaceTest).disk_,&local_1a0,(string *)local_30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,"subdir/subsubdir/..",&local_1c9);
      TVar4 = RealDiskInterface::Stat
                        (&(this->super_DiskInterfaceTest).disk_,&local_1c8,(string *)local_30);
      testing::Test::Check
                (pTVar1,TVar3 == TVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                 ,0x68,"disk_.Stat(\"subdir\", &err) == disk_.Stat(\"subdir/subsubdir/..\", &err)");
      std::__cxx11::string::~string((string *)&local_1c8);
      std::allocator<char>::~allocator(&local_1c9);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::allocator<char>::~allocator(&local_1a1);
      pTVar1 = g_current_test;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f0,"subdir/subsubdir",&local_1f1);
      TVar3 = RealDiskInterface::Stat
                        (&(this->super_DiskInterfaceTest).disk_,&local_1f0,(string *)local_30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_218,"subdir/subsubdir/.",&local_219);
      TVar4 = RealDiskInterface::Stat
                        (&(this->super_DiskInterfaceTest).disk_,&local_218,(string *)local_30);
      testing::Test::Check
                (pTVar1,TVar3 == TVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                 ,0x6a,
                 "disk_.Stat(\"subdir/subsubdir\", &err) == disk_.Stat(\"subdir/subsubdir/.\", &err)"
                );
      std::__cxx11::string::~string((string *)&local_218);
      std::allocator<char>::~allocator(&local_219);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::allocator<char>::~allocator(&local_1f1);
      local_68 = 0;
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      local_68 = 1;
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
    local_68 = 1;
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(DiskInterfaceTest, StatExistingDir) {
  string err;
  ASSERT_TRUE(disk_.MakeDir("subdir"));
  ASSERT_TRUE(disk_.MakeDir("subdir/subsubdir"));
  EXPECT_GT(disk_.Stat("..", &err), 1);
  EXPECT_EQ("", err);
  EXPECT_GT(disk_.Stat(".", &err), 1);
  EXPECT_EQ("", err);
  EXPECT_GT(disk_.Stat("subdir", &err), 1);
  EXPECT_EQ("", err);
  EXPECT_GT(disk_.Stat("subdir/subsubdir", &err), 1);
  EXPECT_EQ("", err);

  EXPECT_EQ(disk_.Stat("subdir", &err),
            disk_.Stat("subdir/.", &err));
  EXPECT_EQ(disk_.Stat("subdir", &err),
            disk_.Stat("subdir/subsubdir/..", &err));
  EXPECT_EQ(disk_.Stat("subdir/subsubdir", &err),
            disk_.Stat("subdir/subsubdir/.", &err));
}